

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

DWORD GetCurrentDirectoryW(DWORD nBufferLength,LPWSTR lpBuffer)

{
  uint uVar1;
  int iVar2;
  DWORD dwErrCode;
  char *__s;
  size_t sVar3;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00327b51;
  __s = PAL__getcwd((char *)0x0,0x401);
  if (__s == (char *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00327b51;
    dwErrCode = DIRGetLastErrorFromErrno();
    uVar1 = 0;
    PAL_free((void *)0x0);
    if (dwErrCode != 0) goto LAB_00327b1a;
  }
  else {
    sVar3 = strlen(__s);
    uVar1 = MultiByteToWideChar(0,0,__s,(int)sVar3,(LPWSTR)0x0,0);
    if (uVar1 < nBufferLength) {
      iVar2 = MultiByteToWideChar(0,0,__s,(int)sVar3 + 1,lpBuffer,nBufferLength);
      if (iVar2 == 0) {
        fprintf(_stderr,"] %s %s:%d","GetCurrentDirectoryW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                ,0x19d);
        fprintf(_stderr,"MultiByteToWideChar failure!\n");
        PAL_free(__s);
        dwErrCode = 0x54f;
LAB_00327b1a:
        SetLastError(dwErrCode);
        uVar1 = 0;
        goto LAB_00327b38;
      }
    }
    else {
      uVar1 = uVar1 + 1;
    }
    PAL_free(__s);
  }
LAB_00327b38:
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_00327b51:
  abort();
}

Assistant:

DWORD
PALAPI
GetCurrentDirectoryW(
             IN DWORD nBufferLength,
             OUT LPWSTR lpBuffer)
{
    DWORD dwWideLen = 0;
    DWORD dwLastError = 0;

    char  *current_dir;
    int   dir_len;

    PERF_ENTRY(GetCurrentDirectoryW);
    ENTRY("GetCurrentDirectoryW(nBufferLength=%u, lpBuffer=%p)\n",
          nBufferLength, lpBuffer);

    current_dir = PAL__getcwd( NULL, MAX_LONGPATH + 1 );

    if ( !current_dir )
    {
        WARN( "PAL__getcwd returned NULL\n" );
        dwLastError = DIRGetLastErrorFromErrno();
        goto done;
    }

    dir_len = strlen( current_dir );
    dwWideLen = MultiByteToWideChar( CP_ACP, 0,
                 current_dir, dir_len,
                 NULL, 0 );

    /* if the supplied buffer isn't long enough, return the required
       length, including room for the NULL terminator */
    if ( nBufferLength > dwWideLen )
    {
        if(!MultiByteToWideChar( CP_ACP, 0, current_dir, dir_len + 1,
                     lpBuffer, nBufferLength ))
        {
            ASSERT("MultiByteToWideChar failure!\n");
            dwWideLen = 0;
            dwLastError = ERROR_INTERNAL_ERROR;
        }
    }
    else
    {
        ++dwWideLen; /* include space for the NULL */
    }

done:
    PAL_free( current_dir );

    if ( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("GetCurrentDirectoryW returns DWORD %u\n", dwWideLen);
    PERF_EXIT(GetCurrentDirectoryW);
    return dwWideLen;
}